

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMocker<void_()>::PerformDefaultAction
          (FunctionMocker<void_()> *this,ArgumentTuple *args,string *call_description)

{
  pointer pcVar1;
  OnCallSpec<void_()> *this_00;
  Action<void_()> *pAVar2;
  string message;
  long *local_30 [2];
  long local_20 [2];
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<void_()> *)0x0) {
    pAVar2 = OnCallSpec<void_()>::GetAction(this_00);
    Action<void_()>::Perform(pAVar2);
    return;
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }